

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InternalException::InternalException<long,unsigned_long,unsigned_int>
          (InternalException *this,string *msg,long params,unsigned_long params_1,uint params_2)

{
  undefined4 in_register_00000084;
  uint in_R9D;
  string local_30;
  
  Exception::ConstructMessage<long,unsigned_long,unsigned_int>
            (&local_30,(Exception *)msg,(string *)params,params_1,
             CONCAT44(in_register_00000084,params_2),in_R9D);
  InternalException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}